

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtsStreamReader.cpp
# Opt level: O0

int DTSStreamReader::buf14To16(uint8_t *p_out,uint8_t *p_in,int i_in,int i_le)

{
  char cVar1;
  int *piVar2;
  byte bVar3;
  int local_3c;
  int local_38;
  int local_34;
  int need;
  int i;
  int i_out;
  int bits_out;
  int bits_in;
  uchar cur;
  int iStack_1c;
  uchar tmp;
  int i_le_local;
  int i_in_local;
  uint8_t *p_in_local;
  uint8_t *p_out_local;
  
  bits_out._2_1_ = 0;
  i = 0;
  need = 0;
  bits_in = i_le;
  iStack_1c = i_in;
  _i_le_local = p_in;
  p_in_local = p_out;
  for (local_34 = 0; local_34 < iStack_1c; local_34 = local_34 + 1) {
    if (local_34 % 2 == 0) {
      bits_out._3_1_ = _i_le_local[local_34 + bits_in] & 0x3f;
      i_out = 6;
    }
    else {
      bits_out._3_1_ = _i_le_local[local_34 - bits_in];
      i_out = 8;
    }
    if (i < 8) {
      local_3c = 8 - i;
      piVar2 = std::min<int>(&local_3c,&i_out);
      local_38 = *piVar2;
      bVar3 = (byte)local_38;
      cVar1 = (char)i_out;
      bits_out._2_1_ =
           bits_out._2_1_ << (bVar3 & 0x1f) |
           (byte)((int)(uint)bits_out._3_1_ >> (cVar1 - bVar3 & 0x1f));
      bits_out._3_1_ =
           (byte)((int)(uint)(byte)(bits_out._3_1_ << (('\b' - cVar1) + bVar3 & 0x1f)) >>
                 (('\b' - cVar1) + bVar3 & 0x1f));
      i_out = i_out - local_38;
      i = local_38 + i;
    }
    if (i == 8) {
      p_in_local[need] = bits_out._2_1_;
      bits_out._2_1_ = 0;
      i = 0;
      need = need + 1;
    }
    i = i_out + i;
    bits_out._2_1_ = bits_out._2_1_ << ((byte)i_out & 0x1f) | bits_out._3_1_;
  }
  return need;
}

Assistant:

int DTSStreamReader::buf14To16(uint8_t* p_out, const uint8_t* p_in, const int i_in, const int i_le)
{
    unsigned char tmp, cur = 0;
    int bits_in, bits_out = 0;
    int i_out = 0;
    for (int i = 0; i < i_in; i++)
    {
        if (i % 2)
        {
            tmp = p_in[i - i_le];
            bits_in = 8;
        }
        else
        {
            tmp = p_in[i + i_le] & 0x3F;
            bits_in = 8 - 2;
        }

        if (bits_out < 8)
        {
            const int need = (std::min)(8 - bits_out, bits_in);
            cur <<= need;
            cur |= (tmp >> (bits_in - need));
            tmp <<= (8 - bits_in + need);
            tmp >>= (8 - bits_in + need);
            bits_in -= need;
            bits_out += need;
        }
        if (bits_out == 8)
        {
            p_out[i_out] = cur;
            cur = 0;
            bits_out = 0;
            i_out++;
        }

        bits_out += bits_in;
        cur <<= bits_in;
        cur |= tmp;
    }
    return i_out;
}